

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Window * sqlite3WindowAlloc(Parse *pParse,int eType,int eStart,Expr *pStart,int eEnd,Expr *pEnd)

{
  Window *pWVar1;
  Expr *pEVar2;
  Window *pWin;
  Expr *pEnd_local;
  int eEnd_local;
  Expr *pStart_local;
  int eStart_local;
  int eType_local;
  Parse *pParse_local;
  
  if ((eType == 0x56) && ((pStart != (Expr *)0x0 || (pEnd != (Expr *)0x0)))) {
    sqlite3ErrorMsg(pParse,"RANGE must use only UNBOUNDED or CURRENT ROW");
  }
  else if (((eStart == 0x52) && (eEnd == 0x55)) ||
          ((eStart == 0x53 && ((eEnd == 0x55 || (eEnd == 0x52)))))) {
    sqlite3ErrorMsg(pParse,"unsupported frame delimiter for ROWS");
  }
  else {
    pWVar1 = (Window *)sqlite3DbMallocZero(pParse->db,0x70);
    if (pWVar1 != (Window *)0x0) {
      pWVar1->eType = (u8)eType;
      pWVar1->eStart = (u8)eStart;
      pWVar1->eEnd = (u8)eEnd;
      pEVar2 = sqlite3WindowOffsetExpr(pParse,pEnd);
      pWVar1->pEnd = pEVar2;
      pEVar2 = sqlite3WindowOffsetExpr(pParse,pStart);
      pWVar1->pStart = pEVar2;
      return pWVar1;
    }
  }
  sqlite3ExprDelete(pParse->db,pEnd);
  sqlite3ExprDelete(pParse->db,pStart);
  return (Window *)0x0;
}

Assistant:

SQLITE_PRIVATE Window *sqlite3WindowAlloc(
  Parse *pParse,    /* Parsing context */
  int eType,        /* Frame type. TK_RANGE or TK_ROWS */
  int eStart,       /* Start type: CURRENT, PRECEDING, FOLLOWING, UNBOUNDED */
  Expr *pStart,     /* Start window size if TK_PRECEDING or FOLLOWING */
  int eEnd,         /* End type: CURRENT, FOLLOWING, TK_UNBOUNDED, PRECEDING */
  Expr *pEnd        /* End window size if TK_FOLLOWING or PRECEDING */
){
  Window *pWin = 0;

  /* Parser assures the following: */
  assert( eType==TK_RANGE || eType==TK_ROWS );
  assert( eStart==TK_CURRENT || eStart==TK_PRECEDING
           || eStart==TK_UNBOUNDED || eStart==TK_FOLLOWING );
  assert( eEnd==TK_CURRENT || eEnd==TK_FOLLOWING
           || eEnd==TK_UNBOUNDED || eEnd==TK_PRECEDING );
  assert( (eStart==TK_PRECEDING || eStart==TK_FOLLOWING)==(pStart!=0) );
  assert( (eEnd==TK_FOLLOWING || eEnd==TK_PRECEDING)==(pEnd!=0) );


  /* If a frame is declared "RANGE" (not "ROWS"), then it may not use
  ** either "<expr> PRECEDING" or "<expr> FOLLOWING".
  */
  if( eType==TK_RANGE && (pStart!=0 || pEnd!=0) ){
    sqlite3ErrorMsg(pParse, "RANGE must use only UNBOUNDED or CURRENT ROW");
    goto windowAllocErr;
  }

  /* Additionally, the
  ** starting boundary type may not occur earlier in the following list than
  ** the ending boundary type:
  **
  **   UNBOUNDED PRECEDING
  **   <expr> PRECEDING
  **   CURRENT ROW
  **   <expr> FOLLOWING
  **   UNBOUNDED FOLLOWING
  **
  ** The parser ensures that "UNBOUNDED PRECEDING" cannot be used as an ending
  ** boundary, and than "UNBOUNDED FOLLOWING" cannot be used as a starting
  ** frame boundary.
  */
  if( (eStart==TK_CURRENT && eEnd==TK_PRECEDING)
   || (eStart==TK_FOLLOWING && (eEnd==TK_PRECEDING || eEnd==TK_CURRENT))
  ){
    sqlite3ErrorMsg(pParse, "unsupported frame delimiter for ROWS");
    goto windowAllocErr;
  }

  pWin = (Window*)sqlite3DbMallocZero(pParse->db, sizeof(Window));
  if( pWin==0 ) goto windowAllocErr;
  pWin->eType = eType;
  pWin->eStart = eStart;
  pWin->eEnd = eEnd;
  pWin->pEnd = sqlite3WindowOffsetExpr(pParse, pEnd);
  pWin->pStart = sqlite3WindowOffsetExpr(pParse, pStart);
  return pWin;

windowAllocErr:
  sqlite3ExprDelete(pParse->db, pEnd);
  sqlite3ExprDelete(pParse->db, pStart);
  return 0;
}